

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::FreeInput(Codec *this)

{
  if ((this->_input_allocated != 0) && (this->_input_blocks != (uint8_t *)0x0)) {
    SIMDSafeFree(this->_input_blocks);
    this->_input_blocks = (uint8_t *)0x0;
  }
  this->_input_allocated = 0;
  return;
}

Assistant:

void Codec::FreeInput()
{
    if (_input_allocated > 0 &&
        _input_blocks != nullptr)
    {
        SIMDSafeFree(_input_blocks);
        _input_blocks = nullptr;
    }

    _input_allocated = 0;
}